

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_caseJump
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t value,sysbvm_tuple_t caseKeys,sysbvm_tuple_t caseDestinations,
          sysbvm_tuple_t defaultDestination)

{
  long lVar1;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *psVar2;
  uint uVar3;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *instructionObject;
  sysbvm_tuple_t sVar4;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s *psVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  undefined8 uVar9;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s **ppsVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  
  bVar12 = (caseKeys & 0xf) != 0;
  if (bVar12 || caseKeys == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = (ulong)(*(uint *)(caseKeys + 0xc) >> 3);
  }
  bVar13 = (caseDestinations & 0xf) != 0;
  if (bVar13 || caseDestinations == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(uint *)(caseDestinations + 0xc) >> 3;
  }
  if ((uint)uVar11 != uVar3) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeCompiler.c:576: assertion failure: caseCount == sysbvm_array_getSize(caseDestinations)"
              );
  }
  sysbvm_functionBytecodeAssembler_countExtension(context,assembler,uVar11 >> 4);
  sVar4 = sysbvm_array_create(context,uVar11 * 2 + 2);
  bVar14 = sVar4 != 0;
  bVar15 = (sVar4 & 0xf) == 0;
  if (bVar15 && bVar14) {
    *(sysbvm_tuple_t *)(sVar4 + 0x10) = value;
  }
  if (uVar11 == 0) {
    lVar6 = 1;
  }
  else {
    lVar7 = 0x18;
    lVar6 = -1;
    do {
      if (bVar12 || caseKeys == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(undefined8 *)((caseKeys - 8) + lVar7);
      }
      if (bVar15 && bVar14) {
        *(undefined8 *)(sVar4 + lVar7) = uVar9;
      }
      lVar7 = lVar7 + 8;
      lVar1 = uVar11 + lVar6;
      lVar6 = lVar6 + -1;
    } while (lVar1 != 0);
    uVar8 = 0;
    do {
      if (bVar13 || caseDestinations == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(undefined8 *)(caseDestinations + 0x10 + uVar8 * 8);
      }
      if (bVar15 && bVar14) {
        *(undefined8 *)(sVar4 + lVar7 + uVar8 * 8) = uVar9;
      }
      uVar8 = uVar8 + 1;
    } while (uVar11 != uVar8);
    lVar6 = uVar8 - lVar6;
  }
  if (bVar15 && bVar14) {
    *(sysbvm_tuple_t *)(sVar4 + 0x10 + lVar6 * 8) = defaultDestination;
  }
  psVar5 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)
           sysbvm_context_allocatePointerTuple
                     (context,(context->roots).functionBytecodeAssemblerInstruction,9);
  psVar5[1].super.header.field_0.typePointer = 0xe03;
  psVar5[1].super.header.identityHashAndFlags = (int)sVar4;
  psVar5[1].super.header.objectSize = (int)(sVar4 >> 0x20);
  psVar2 = assembler->lastInstruction;
  ppsVar10 = &psVar2->next;
  if (psVar2 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
    ppsVar10 = &assembler->firstInstruction;
  }
  psVar5->previous = psVar2;
  *ppsVar10 = psVar5;
  assembler->lastInstruction = psVar5;
  psVar5->sourceASTNode = assembler->sourceASTNode;
  sVar4 = assembler->sourceEnvironment;
  psVar5->sourcePosition = assembler->sourcePosition;
  psVar5->sourceEnvironment = sVar4;
  return (sysbvm_tuple_t)psVar5;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_caseJump(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t value, sysbvm_tuple_t caseKeys, sysbvm_tuple_t caseDestinations, sysbvm_tuple_t defaultDestination)
{
    size_t caseCount = sysbvm_array_getSize(caseKeys);
    SYSBVM_ASSERT(caseCount == sysbvm_array_getSize(caseDestinations));

    sysbvm_functionBytecodeAssembler_countExtension(context, assembler, caseCount>>4);

    sysbvm_tuple_t operands = sysbvm_array_create(context, 1 + caseCount + caseCount + 1);
    size_t operandIndex = 0;
    sysbvm_array_atPut(operands, operandIndex++, value);
    for(size_t i = 0; i < caseCount; ++i)
        sysbvm_array_atPut(operands, operandIndex++, sysbvm_array_at(caseKeys, i));
    for(size_t i = 0; i < caseCount; ++i)
        sysbvm_array_atPut(operands, operandIndex++, sysbvm_array_at(caseDestinations, i));
    sysbvm_array_atPut(operands, operandIndex++, defaultDestination);

    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_CASE_JUMP, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}